

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x9ab;
  }
  else if (*(int *)((long)arkode_mem + 0x110) == 0) {
    msgfmt = "time-stepping module does not support algebraic solvers";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x9b4;
  }
  else {
    if (*(code **)((long)arkode_mem + 0x140) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x140))();
      return iVar1;
    }
    msgfmt = "time-stepping module does not support this function";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x9c1;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeComputeState",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeComputeState(void* arkode_mem, N_Vector zcor, N_Vector z)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for incompatible time stepper modules */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support algebraic solvers");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine to compute the state (if provided) */
  if (ark_mem->step_computestate)
  {
    return (ark_mem->step_computestate(ark_mem, zcor, z));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}